

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O2

bool __thiscall
llbuild::buildsystem::ShellCommand::processDiscoveredDependencies
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context)

{
  StringRef depsPath;
  StringRef depsPath_00;
  bool bVar1;
  FileSystem *pFVar2;
  BuildSystemDelegate *pBVar3;
  long lVar4;
  Child input;
  string *Str;
  bool bVar5;
  char *pcVar6;
  size_t sVar7;
  Child local_10d8 [3];
  Child local_10c0;
  ulong local_10b8;
  char *local_10a8;
  size_t sStack_10a0;
  pointer local_1098;
  size_type sStack_1090;
  char *local_1088;
  size_t sStack_1080;
  string local_1078;
  Twine local_1058;
  SmallString<4096U> absPath;
  
  if (this->depsStyle == Unused) {
    pBVar3 = BuildSystem::getDelegate(system);
    (*pBVar3->_vptr_BuildSystemDelegate[0xb])
              (pBVar3,this,"missing required \'deps-style\' specifier",0x27);
LAB_0018d619:
    bVar5 = false;
  }
  else {
    Str = (string *)
          (this->depsPaths).
          super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .
          super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
          .
          super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          .super_SmallVectorBase.BeginX;
    lVar4 = (ulong)(this->depsPaths).
                   super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   .
                   super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                   .super_SmallVectorBase.Size << 5;
    while( true ) {
      bVar5 = lVar4 == 0;
      if (bVar5) break;
      llvm::Twine::Twine((Twine *)&absPath.super_SmallVector<char,_4096U>,Str);
      bVar1 = llvm::sys::path::is_absolute((Twine *)&absPath.super_SmallVector<char,_4096U>,native);
      if (bVar1) {
        pFVar2 = BuildSystem::getFileSystem(system);
        (*pFVar2->_vptr_FileSystem[4])(&absPath.super_SmallVector<char,_4096U>,pFVar2,Str);
        input = (Child)absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                       super_SmallVectorTemplateBase<char,_true>.
                       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      }
      else {
        pcVar6 = (this->workingDirectory)._M_dataplus._M_p;
        llvm::SmallVector<char,4096u>::SmallVector<char_const*,void>
                  (&absPath.super_SmallVector<char,_4096U>,pcVar6,
                   pcVar6 + (this->workingDirectory)._M_string_length);
        llvm::Twine::Twine((Twine *)&local_1078,Str);
        llvm::Twine::Twine((Twine *)&local_10c0,"");
        llvm::Twine::Twine((Twine *)local_10d8,"");
        context = (QueueJobContext *)&local_1058;
        llvm::Twine::Twine((Twine *)context,"");
        llvm::sys::path::append
                  (&absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>,
                   (Twine *)&local_1078,(Twine *)&local_10c0,(Twine *)local_10d8,(Twine *)context);
        llvm::sys::fs::make_absolute
                  (&absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>);
        pFVar2 = BuildSystem::getFileSystem(system);
        local_10b8 = (ulong)absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                            super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        local_10c0.twine =
             (Twine *)absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                      super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        llvm::StringRef::str_abi_cxx11_(&local_1078,(StringRef *)&local_10c0);
        (*pFVar2->_vptr_FileSystem[4])(local_10d8,pFVar2,&local_1078);
        input = local_10d8[0];
        local_10d8[0].twine = (Twine *)0x0;
        std::__cxx11::string::_M_dispose();
        llvm::SmallVectorImpl<char>::~SmallVectorImpl
                  (&absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>);
      }
      if (input.twine == (Twine *)0x0) {
        pBVar3 = BuildSystem::getDelegate(system);
        std::operator+(&local_1078,"unable to open dependencies file (",Str);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&absPath
                       ,&local_1078,")");
        (*pBVar3->_vptr_BuildSystemDelegate[0xb])
                  (pBVar3,this,
                   absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,
                   CONCAT44(absPath.super_SmallVector<char,_4096U>.super_SmallVectorImpl<char>.
                            super_SmallVectorTemplateBase<char,_true>.
                            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                            Capacity,absPath.super_SmallVector<char,_4096U>.
                                     super_SmallVectorImpl<char>.
                                     super_SmallVectorTemplateBase<char,_true>.
                                     super_SmallVectorTemplateCommon<char,_void>.
                                     super_SmallVectorBase.Size));
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        goto LAB_0018d619;
      }
      switch(this->depsStyle) {
      case Unused:
        __assert_fail("0 && \"unreachable\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ShellCommand.cpp"
                      ,0x68,
                      "bool llbuild::buildsystem::ShellCommand::processDiscoveredDependencies(BuildSystem &, core::TaskInterface, QueueJobContext *)"
                     );
      case Makefile:
        pcVar6 = (Str->_M_dataplus)._M_p;
        sVar7 = Str->_M_string_length;
        bVar1 = false;
        local_1088 = pcVar6;
        sStack_1080 = sVar7;
        break;
      case DependencyInfo:
        local_1098 = (Str->_M_dataplus)._M_p;
        sStack_1090 = Str->_M_string_length;
        depsPath_00.Data = (Str->_M_dataplus)._M_p;
        depsPath_00.Length = Str->_M_string_length;
        bVar1 = processDependencyInfoDiscoveredDependencies
                          (this,system,ti,context,depsPath_00,(MemoryBuffer *)input.twine);
        goto LAB_0018d564;
      case MakefileIgnoringSubsequentOutputs:
        pcVar6 = (Str->_M_dataplus)._M_p;
        sVar7 = Str->_M_string_length;
        bVar1 = true;
        local_10a8 = pcVar6;
        sStack_10a0 = sVar7;
        break;
      default:
        llvm::report_fatal_error("unknown dependencies style",true);
      }
      depsPath.Length = sVar7;
      depsPath.Data = pcVar6;
      bVar1 = processMakefileDiscoveredDependencies
                        (this,system,ti,context,depsPath,(MemoryBuffer *)input.twine,bVar1);
LAB_0018d564:
      (**(code **)(*input.decUL + 8))(input.twine);
      if (bVar1 == false) {
        return bVar5;
      }
      Str = Str + 1;
      lVar4 = lVar4 + -0x20;
    }
  }
  return bVar5;
}

Assistant:

bool ShellCommand::processDiscoveredDependencies(BuildSystem& system,
                                                 core::TaskInterface ti,
                                                 QueueJobContext* context) {
  // It is an error if the dependencies style is not specified.
  //
  // FIXME: Diagnose this sooner.
  if (depsStyle == DepsStyle::Unused) {
    system.getDelegate().commandHadError(
        this, "missing required 'deps-style' specifier");
    return false;
  }

  for (const auto& depsPath: depsPaths) {
    // Read the dependencies file.
    std::unique_ptr<llvm::MemoryBuffer> input;
    if (llvm::sys::path::is_absolute(depsPath)) {
      input = system.getFileSystem().getFileContents(depsPath);
    } else {
      SmallString<PATH_MAX> absPath = StringRef(workingDirectory);
      llvm::sys::path::append(absPath, depsPath);
      llvm::sys::fs::make_absolute(absPath);
      input = system.getFileSystem().getFileContents(StringRef(absPath));
    }
    if (!input) {
      system.getDelegate().commandHadError(
          this, "unable to open dependencies file (" + depsPath + ")");
      return false;
    }

    switch (depsStyle) {
    case DepsStyle::Unused:
      assert(0 && "unreachable");
      break;

    case DepsStyle::Makefile:
      if (!processMakefileDiscoveredDependencies(
              system, ti, context, depsPath, input.get(), false))
        return false;
      continue;

    case DepsStyle::DependencyInfo:
      if (!processDependencyInfoDiscoveredDependencies(
              system, ti, context, depsPath, input.get()))
        return false;
      continue;

    case DepsStyle::MakefileIgnoringSubsequentOutputs:
      if (!processMakefileDiscoveredDependencies(
              system, ti, context, depsPath, input.get(), true))
        return false;
      continue;
    }
      
    llvm::report_fatal_error("unknown dependencies style");
  }

  return true;
}